

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

void xmlXPathFreeValueTree(xmlNodeSetPtr obj)

{
  xmlNodePtr cur;
  long lVar1;
  
  if (obj != (xmlNodeSetPtr)0x0) {
    if (obj->nodeTab != (xmlNodePtr *)0x0) {
      for (lVar1 = 0; lVar1 < obj->nodeNr; lVar1 = lVar1 + 1) {
        cur = obj->nodeTab[lVar1];
        if (cur != (xmlNodePtr)0x0) {
          if (cur->type == XML_NAMESPACE_DECL) {
            xmlXPathNodeSetFreeNs((xmlNsPtr)cur);
          }
          else {
            xmlFreeNodeList(cur);
          }
        }
      }
      (*xmlFree)(obj->nodeTab);
    }
    (*xmlFree)(obj);
    return;
  }
  return;
}

Assistant:

static void
xmlXPathFreeValueTree(xmlNodeSetPtr obj) {
    int i;

    if (obj == NULL) return;

    if (obj->nodeTab != NULL) {
	for (i = 0;i < obj->nodeNr;i++) {
	    if (obj->nodeTab[i] != NULL) {
		if (obj->nodeTab[i]->type == XML_NAMESPACE_DECL) {
		    xmlXPathNodeSetFreeNs((xmlNsPtr) obj->nodeTab[i]);
		} else {
		    xmlFreeNodeList(obj->nodeTab[i]);
		}
	    }
	}
	xmlFree(obj->nodeTab);
    }
    xmlFree(obj);
}